

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

int32_t u_parseCodePointRange(char *s,uint32_t *pStart,uint32_t *pEnd,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  char *in_RAX;
  char *pcVar2;
  char *local_18;
  
  local_18 = in_RAX;
  iVar1 = u_parseCodePointRangeAnyTerminator(s,pStart,pEnd,&local_18,pErrorCode);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar2 = u_skipWhitespace(local_18);
    if ((*pcVar2 != '\0') && (*pcVar2 != ';')) {
      *pErrorCode = U_PARSE_ERROR;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRange(const char *s,
                      uint32_t *pStart, uint32_t *pEnd,
                      UErrorCode *pErrorCode) {
    const char *terminator;
    int32_t rangeLength=
        u_parseCodePointRangeAnyTerminator(s, pStart, pEnd, &terminator, pErrorCode);
    if(U_SUCCESS(*pErrorCode)) {
        terminator=u_skipWhitespace(terminator);
        if(*terminator!=';' && *terminator!=0) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }
    }
    return rangeLength;
}